

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * anon_unknown.dwarf_20a43d::CreateStore
                    (ExpressionContext *ctx,VmModule *module,SynBase *source,TypeBase *type,
                    VmValue *address,VmValue *value,uint offset)

{
  int iVar1;
  Allocator *pAVar2;
  VariableData *pVVar3;
  VmInstructionType VVar4;
  TypeRef *pTVar5;
  VmConstant *pVVar6;
  VmValue *pVVar7;
  VmInstruction *pVVar8;
  uint dstOffset;
  uint srcOffset;
  VmType VVar9;
  
  VVar9 = GetVmType(ctx,type);
  if (((value->type).type != VVar9.type) || ((value->type).size != VVar9.size)) {
    __assert_fail("value->type == GetVmType(ctx, type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x37f,
                  "VmValue *(anonymous namespace)::CreateStore(ExpressionContext &, VmModule *, SynBase *, TypeBase *, VmValue *, VmValue *, unsigned int)"
                 );
  }
  if (type->size == 0) {
    pVVar7 = CreateVoid(module);
    return pVVar7;
  }
  if ((address == (VmValue *)0x0) || (address->typeID != 1)) {
    if ((value->typeID != 1) || (value[1].hasMemoryAccess != true)) {
      VVar4 = GetStoreInstruction(ctx,type);
      pVVar6 = CreateConstantInt(ctx->allocator,source,offset);
      goto LAB_0024c54e;
    }
    pAVar2 = ctx->allocator;
    iVar1 = *(int *)&value[1]._vptr_VmValue;
    pVVar3 = (VariableData *)value[1].comment.end;
    pTVar5 = ExpressionContext::GetReferenceType(ctx,type);
    pVVar6 = CreateConstantPointer(pAVar2,source,iVar1,pVVar3,&pTVar5->super_TypeBase,true);
    srcOffset = (uint)type->size;
    dstOffset = offset;
  }
  else {
    pAVar2 = module->allocator;
    iVar1 = *(int *)&address[1]._vptr_VmValue;
    pVVar3 = (VariableData *)address[1].comment.end;
    pTVar5 = ExpressionContext::GetReferenceType(ctx,type);
    address = &CreateConstantPointer
                         (pAVar2,source,offset + iVar1,pVVar3,&pTVar5->super_TypeBase,true)->
               super_VmValue;
    if ((value->typeID != 1) || (value[1].hasMemoryAccess != true)) {
      VVar4 = GetStoreInstruction(ctx,type);
      pVVar6 = CreateConstantInt(ctx->allocator,source,0);
LAB_0024c54e:
      pVVar8 = CreateInstruction((anon_unknown_dwarf_20a43d *)module,(VmModule *)source,
                                 (SynBase *)0x0,(VmType)(ZEXT416(VVar4) << 0x40),
                                 (VmInstructionType)address,&pVVar6->super_VmValue,value,
                                 (VmValue *)module);
      return &pVVar8->super_VmValue;
    }
    pAVar2 = ctx->allocator;
    iVar1 = *(int *)&value[1]._vptr_VmValue;
    pVVar3 = (VariableData *)value[1].comment.end;
    pTVar5 = ExpressionContext::GetReferenceType(ctx,type);
    pVVar6 = CreateConstantPointer(pAVar2,source,iVar1,pVVar3,&pTVar5->super_TypeBase,true);
    srcOffset = (uint)type->size;
    dstOffset = 0;
  }
  pVVar7 = CreateMemCopy(module,source,address,dstOffset,&pVVar6->super_VmValue,srcOffset,offset);
  return pVVar7;
}

Assistant:

VmValue* CreateStore(ExpressionContext &ctx, VmModule *module, SynBase *source, TypeBase *type, VmValue *address, VmValue *value, unsigned offset)
	{
		assert(value->type == GetVmType(ctx, type));

		if(type->size == 0)
			return CreateVoid(module);

		if(VmConstant *constantAddress = getType<VmConstant>(address))
		{
			VmConstant *shiftAddress = CreateConstantPointer(module->allocator, source, constantAddress->iValue + offset, constantAddress->container, ctx.GetReferenceType(type), true);

			if(VmConstant *constant = getType<VmConstant>(value))
			{
				if(constant->isReference)
				{
					VmConstant *pointer = CreateConstantPointer(ctx.allocator, source, constant->iValue, constant->container, ctx.GetReferenceType(type), true);

					return CreateMemCopy(module, source, shiftAddress, 0, pointer, 0, int(type->size));
				}
			}

			return CreateInstruction(module, source, VmType::Void, GetStoreInstruction(ctx, type), shiftAddress, CreateConstantInt(ctx.allocator, source, 0), value);
		}

		if(VmConstant *constant = getType<VmConstant>(value))
		{
			if(constant->isReference)
			{
				VmConstant *pointer = CreateConstantPointer(ctx.allocator, source, constant->iValue, constant->container, ctx.GetReferenceType(type), true);

				return CreateMemCopy(module, source, address, offset, pointer, 0, int(type->size));
			}
		}

		return CreateInstruction(module, source, VmType::Void, GetStoreInstruction(ctx, type), address, CreateConstantInt(ctx.allocator, source, offset), value);
	}